

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::Log(cmCTest *this,int logType,char *file,int line,char *msg,bool suppress)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  ostream *poVar4;
  ostream *err;
  ostream *out;
  bool display;
  bool suppress_local;
  char *msg_local;
  int line_local;
  char *file_local;
  int logType_local;
  cmCTest *this_local;
  
  if ((((msg != (char *)0x0) && (*msg != '\0')) && ((!suppress || (logType == 6)))) &&
     ((logType != 3 || (((this->Debug & 1U) == 0 && ((this->ExtraVerbose & 1U) == 0)))))) {
    if (this->OutputLogFile != (cmGeneratedFileStream *)0x0) {
      bVar1 = true;
      if ((logType == 0) && ((this->Debug & 1U) == 0)) {
        bVar1 = false;
      }
      if (((logType == 4) && ((this->Debug & 1U) == 0)) && ((this->ExtraVerbose & 1U) == 0)) {
        bVar1 = false;
      }
      if (bVar1) {
        if ((this->ShowLineNumbers & 1U) != 0) {
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             (this->OutputLogFile,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<(poVar2,file);
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
          std::operator<<(poVar2," ");
        }
        if (logType != this->OutputLogFileLastTag) {
          std::operator<<((ostream *)this->OutputLogFile,"[");
          if ((logType < 7) && (-1 < logType)) {
            std::operator<<((ostream *)this->OutputLogFile,cmCTestStringLogType[logType]);
          }
          else {
            std::operator<<((ostream *)this->OutputLogFile,"OTHER");
          }
          poVar2 = std::operator<<((ostream *)this->OutputLogFile,"] ");
          pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
        }
        poVar2 = std::operator<<((ostream *)this->OutputLogFile,msg);
        std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
        if (logType != this->OutputLogFileLastTag) {
          pvVar3 = (void *)std::ostream::operator<<
                                     (this->OutputLogFile,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
          this->OutputLogFileLastTag = logType;
        }
      }
    }
    if ((this->Quiet & 1U) == 0) {
      poVar2 = this->StreamOut;
      poVar4 = this->StreamErr;
      switch(logType) {
      case 0:
        if ((this->Debug & 1U) != 0) {
          if ((this->ShowLineNumbers & 1U) != 0) {
            poVar4 = (ostream *)
                     std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<(poVar4,file);
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
            std::operator<<(poVar4," ");
          }
          std::operator<<(poVar2,msg);
          std::ostream::flush();
        }
        break;
      case 1:
      case 2:
        if (((this->Debug & 1U) != 0) || ((this->Verbose & 1U) != 0)) {
          if ((this->ShowLineNumbers & 1U) != 0) {
            poVar4 = (ostream *)
                     std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<(poVar4,file);
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
            std::operator<<(poVar4," ");
          }
          std::operator<<(poVar2,msg);
          std::ostream::flush();
        }
        break;
      default:
        if ((this->ShowLineNumbers & 1U) != 0) {
          poVar4 = (ostream *)
                   std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,file);
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
          std::operator<<(poVar4," ");
        }
        std::operator<<(poVar2,msg);
        std::ostream::flush();
        break;
      case 4:
        if (((this->Debug & 1U) != 0) || ((this->ExtraVerbose & 1U) != 0)) {
          if ((this->ShowLineNumbers & 1U) != 0) {
            poVar4 = (ostream *)
                     std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<(poVar4,file);
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
            std::operator<<(poVar4," ");
          }
          std::operator<<(poVar2,msg);
          std::ostream::flush();
        }
        break;
      case 5:
        if ((this->ShowLineNumbers & 1U) != 0) {
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<(poVar2,file);
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
          std::operator<<(poVar2," ");
        }
        std::operator<<(poVar4,msg);
        std::ostream::flush();
        break;
      case 6:
        if ((this->ShowLineNumbers & 1U) != 0) {
          poVar2 = (ostream *)
                   std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<(poVar2,file);
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
          std::operator<<(poVar2," ");
        }
        std::operator<<(poVar4,msg);
        std::ostream::flush();
        cmSystemTools::SetErrorOccured();
      }
    }
  }
  return;
}

Assistant:

void cmCTest::Log(int logType, const char* file, int line, const char* msg,
                  bool suppress)
{
  if (!msg || !*msg) {
    return;
  }
  if (suppress && logType != cmCTest::ERROR_MESSAGE) {
    return;
  }
  if (logType == cmCTest::HANDLER_PROGRESS_OUTPUT &&
      (this->Debug || this->ExtraVerbose)) {
    return;
  }
  if (this->OutputLogFile) {
    bool display = true;
    if (logType == cmCTest::DEBUG && !this->Debug) {
      display = false;
    }
    if (logType == cmCTest::HANDLER_VERBOSE_OUTPUT && !this->Debug &&
        !this->ExtraVerbose) {
      display = false;
    }
    if (display) {
      cmCTestLogOutputFileLine(*this->OutputLogFile);
      if (logType != this->OutputLogFileLastTag) {
        *this->OutputLogFile << "[";
        if (logType >= OTHER || logType < 0) {
          *this->OutputLogFile << "OTHER";
        } else {
          *this->OutputLogFile << cmCTestStringLogType[logType];
        }
        *this->OutputLogFile << "] " << std::endl << std::flush;
      }
      *this->OutputLogFile << msg << std::flush;
      if (logType != this->OutputLogFileLastTag) {
        *this->OutputLogFile << std::endl << std::flush;
        this->OutputLogFileLastTag = logType;
      }
    }
  }
  if (!this->Quiet) {
    std::ostream& out = *this->StreamOut;
    std::ostream& err = *this->StreamErr;
    switch (logType) {
      case DEBUG:
        if (this->Debug) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case OUTPUT:
      case HANDLER_OUTPUT:
        if (this->Debug || this->Verbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case HANDLER_VERBOSE_OUTPUT:
        if (this->Debug || this->ExtraVerbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case WARNING:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        break;
      case ERROR_MESSAGE:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        cmSystemTools::SetErrorOccured();
        break;
      default:
        cmCTestLogOutputFileLine(out);
        out << msg;
        out.flush();
    }
  }
}